

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_search_facade.h
# Opt level: O2

SEARCH_METHODS
av1_get_default_mv_search_method(MACROBLOCK *x,MV_SPEED_FEATURES *mv_sf,BLOCK_SIZE bsize)

{
  byte bVar1;
  byte bVar2;
  undefined7 in_register_00000011;
  ulong uVar3;
  
  bVar1 = mv_sf->search_method;
  uVar3 = CONCAT71(in_register_00000011,bsize) & 0xffffffff;
  bVar2 = block_size_high[uVar3];
  if (block_size_wide[uVar3] < block_size_high[uVar3]) {
    bVar2 = block_size_wide[uVar3];
  }
  if ((mv_sf->use_bsize_dependent_search_method == 1 && 0x1f < bVar2) ||
     (((0xf < bVar2 && 1 < mv_sf->use_bsize_dependent_search_method &&
       ((x->content_state_sb).source_sad_nonrd < kHighSad)) && (x->qindex < 0xc0)))) {
    if (10 < bVar1) {
      return '\0';
    }
    bVar1 = (&DAT_004ba580)[bVar1];
  }
  return bVar1;
}

Assistant:

static inline SEARCH_METHODS av1_get_default_mv_search_method(
    const MACROBLOCK *x, const MV_SPEED_FEATURES *mv_sf, BLOCK_SIZE bsize) {
  SEARCH_METHODS search_method = mv_sf->search_method;
  const int sf_blk_search_method = mv_sf->use_bsize_dependent_search_method;
  const int min_dim = AOMMIN(block_size_wide[bsize], block_size_high[bsize]);
  const int qband = x->qindex >> (QINDEX_BITS - 2);
  const bool use_faster_search_method =
      (sf_blk_search_method == 1 && min_dim >= 32) ||
      (sf_blk_search_method >= 2 && min_dim >= 16 &&
       x->content_state_sb.source_sad_nonrd <= kMedSad && qband < 3);

  if (use_faster_search_method) {
    search_method = av1_get_faster_search_method(search_method);
  }
  return search_method;
}